

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liveglsl_tests.cpp
# Opt level: O0

void utest_register_filewatcher_add_watch_modify_1(void)

{
  size_t sVar1;
  size_t sVar2;
  char *__s;
  char *name;
  size_t name_size;
  char *name_part;
  size_t index;
  
  sVar1 = utest_state.tests_length;
  utest_state.tests_length = utest_state.tests_length + 1;
  sVar2 = strlen("filewatcher.add_watch_modify_1");
  __s = (char *)malloc(sVar2 + 1);
  utest_state.tests =
       (utest_test_state_s *)realloc(utest_state.tests,utest_state.tests_length * 0x18);
  utest_state.tests[sVar1].func = utest_filewatcher_add_watch_modify_1;
  utest_state.tests[sVar1].name = __s;
  snprintf(__s,sVar2 + 1,"%s","filewatcher.add_watch_modify_1");
  return;
}

Assistant:

UTEST(filewatcher, add_watch_modify_1) {
    const char* file_path = "test_file.txt";
    std::ofstream file(file_path);
    file << "File dummy content";
    file.close();

    bool callback_called = false;
    HFileWatcher watcher = FileWatcherCreate(OnFileChanged, &callback_called, 16);
    FileWatcherAddWatch(watcher, file_path);

    std::this_thread::sleep_for(std::chrono::milliseconds(100));

    T(!callback_called);

    FileWatcherRemoveWatch(watcher, file_path);
    FileWatcherDestroy(watcher);

    std::remove(file_path);
}